

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::D_formatter<spdlog::details::scoped_padder>::format
          (D_formatter<spdlog::details::scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  byte bVar1;
  size_t sVar2;
  uint uVar3;
  ulong uVar4;
  basic_string_view<char> fmt;
  basic_string_view<char> fmt_00;
  basic_string_view<char> fmt_01;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args_00;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args_01;
  scoped_padder p;
  ulong local_88 [2];
  scoped_padder local_78;
  buffer<char> local_50;
  memory_buf_t *local_30;
  
  scoped_padder::scoped_padder(&local_78,10,&(this->super_flag_formatter).padinfo_,dest);
  uVar3 = tm_time->tm_mon + 1;
  if (uVar3 < 100) {
    sVar2 = (dest->super_buffer<char>).size_;
    uVar4 = sVar2 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar4) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar2 = (dest->super_buffer<char>).size_;
      uVar4 = sVar2 + 1;
    }
    bVar1 = (byte)((uVar3 & 0xff) / 10);
    (dest->super_buffer<char>).size_ = uVar4;
    (dest->super_buffer<char>).ptr_[sVar2] = bVar1 | 0x30;
    sVar2 = (dest->super_buffer<char>).size_;
    uVar4 = sVar2 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar4) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar2 = (dest->super_buffer<char>).size_;
      uVar4 = sVar2 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar4;
    (dest->super_buffer<char>).ptr_[sVar2] = (char)uVar3 + bVar1 * -10 | 0x30;
  }
  else {
    local_88[0] = (ulong)uVar3;
    local_50.size_ = (dest->super_buffer<char>).size_;
    local_50._vptr_buffer = (_func_int **)&PTR_grow_001c99b0;
    fmt.size_ = 5;
    fmt.data_ = "{:02}";
    args.field_1.values_ =
         (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_88;
    args.desc_ = 1;
    local_50.capacity_ = local_50.size_;
    local_30 = dest;
    ::fmt::v9::detail::vformat_to<char>(&local_50,fmt,args,(locale_ref)0x0);
  }
  sVar2 = (dest->super_buffer<char>).size_;
  uVar4 = sVar2 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar4) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    sVar2 = (dest->super_buffer<char>).size_;
    uVar4 = sVar2 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar4;
  (dest->super_buffer<char>).ptr_[sVar2] = '/';
  uVar3 = tm_time->tm_mday;
  if ((ulong)uVar3 < 100) {
    sVar2 = (dest->super_buffer<char>).size_;
    uVar4 = sVar2 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar4) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar2 = (dest->super_buffer<char>).size_;
      uVar4 = sVar2 + 1;
    }
    bVar1 = (byte)((uVar3 & 0xff) / 10);
    (dest->super_buffer<char>).size_ = uVar4;
    (dest->super_buffer<char>).ptr_[sVar2] = bVar1 | 0x30;
    sVar2 = (dest->super_buffer<char>).size_;
    uVar4 = sVar2 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar4) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar2 = (dest->super_buffer<char>).size_;
      uVar4 = sVar2 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar4;
    (dest->super_buffer<char>).ptr_[sVar2] = (char)uVar3 + bVar1 * -10 | 0x30;
  }
  else {
    local_50.size_ = (dest->super_buffer<char>).size_;
    local_50._vptr_buffer = (_func_int **)&PTR_grow_001c99b0;
    fmt_00.size_ = 5;
    fmt_00.data_ = "{:02}";
    args_00.field_1.values_ =
         (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_88;
    args_00.desc_ = 1;
    local_88[0] = (ulong)uVar3;
    local_50.capacity_ = local_50.size_;
    local_30 = dest;
    ::fmt::v9::detail::vformat_to<char>(&local_50,fmt_00,args_00,(locale_ref)0x0);
  }
  sVar2 = (dest->super_buffer<char>).size_;
  uVar4 = sVar2 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar4) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    sVar2 = (dest->super_buffer<char>).size_;
    uVar4 = sVar2 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar4;
  (dest->super_buffer<char>).ptr_[sVar2] = '/';
  uVar3 = tm_time->tm_year % 100;
  if (uVar3 < 100) {
    sVar2 = (dest->super_buffer<char>).size_;
    uVar4 = sVar2 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar4) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar2 = (dest->super_buffer<char>).size_;
      uVar4 = sVar2 + 1;
    }
    bVar1 = (byte)((uVar3 & 0xff) / 10);
    (dest->super_buffer<char>).size_ = uVar4;
    (dest->super_buffer<char>).ptr_[sVar2] = bVar1 | 0x30;
    sVar2 = (dest->super_buffer<char>).size_;
    uVar4 = sVar2 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar4) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar2 = (dest->super_buffer<char>).size_;
      uVar4 = sVar2 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar4;
    (dest->super_buffer<char>).ptr_[sVar2] = (char)uVar3 + bVar1 * -10 | 0x30;
  }
  else {
    local_88[0] = (ulong)uVar3;
    local_50.size_ = (dest->super_buffer<char>).size_;
    local_50._vptr_buffer = (_func_int **)&PTR_grow_001c99b0;
    fmt_01.size_ = 5;
    fmt_01.data_ = "{:02}";
    args_01.field_1.values_ =
         (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_88;
    args_01.desc_ = 1;
    local_50.capacity_ = local_50.size_;
    local_30 = dest;
    ::fmt::v9::detail::vformat_to<char>(&local_50,fmt_01,args_01,(locale_ref)0x0);
  }
  scoped_padder::~scoped_padder(&local_78);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 10;
        ScopedPadder p(field_size, padinfo_, dest);

        fmt_helper::pad2(tm_time.tm_mon + 1, dest);
        dest.push_back('/');
        fmt_helper::pad2(tm_time.tm_mday, dest);
        dest.push_back('/');
        fmt_helper::pad2(tm_time.tm_year % 100, dest);
    }